

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(ImGuiContext_conflict *context)

{
  ImGuiViewportP *this;
  ImVector<ImGuiViewport_*> *this_00;
  ImGuiViewportP_conflict1 **ppIVar1;
  byte local_89;
  ImGuiViewportP_conflict1 *local_88 [4];
  ImGuiViewportP *local_68;
  ImGuiViewportP_conflict1 *viewport;
  ImGuiSettingsHandler_conflict ini_handler;
  ImGuiContext_conflict *g;
  ImGuiContext_conflict *context_local;
  
  local_89 = 0;
  if ((context->Initialized & 1U) == 0) {
    local_89 = context->SettingsLoaded ^ 0xff;
  }
  ini_handler.UserData = context;
  if ((local_89 & 1) == 0) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x10e6,"void ImGui::Initialize(ImGuiContext *)");
  }
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)&viewport);
  viewport = (ImGuiViewportP_conflict1 *)0x3449b0;
  ini_handler.TypeName._0_4_ = ImHashStr("Window",0,0);
  ini_handler._8_8_ = WindowSettingsHandler_ClearAll;
  ini_handler.ReadInitFn = WindowSettingsHandler_ReadOpen;
  ini_handler.ReadOpenFn = WindowSettingsHandler_ReadLine;
  ini_handler.ReadLineFn = WindowSettingsHandler_ApplyAll;
  ini_handler.ApplyAllFn = WindowSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back
            ((ImVector<ImGuiSettingsHandler> *)((long)ini_handler.UserData + 0x3270),
             (ImGuiSettingsHandler_conflict *)&viewport);
  TableSettingsInstallHandler((ImGuiContext *)context);
  MemAlloc(0x130);
  this = (ImGuiViewportP *)operator_new(0x130);
  ImGuiViewportP::ImGuiViewportP(this);
  (this->_ImGuiViewport).ID = 0x11111111;
  *(undefined4 *)&(this->_ImGuiViewport).field_0x5c = 0;
  *(undefined1 *)((long)&this->LastAlpha + 2) = 1;
  (this->_ImGuiViewport).Flags = 4;
  local_68 = this;
  ImVector<ImGuiViewportP_*>::push_back
            ((ImVector<ImGuiViewportP_*> *)((long)ini_handler.UserData + 0x1f28),
             (ImGuiViewportP_conflict1 **)&local_68);
  this_00 = (ImVector<ImGuiViewport_*> *)((long)ini_handler.UserData + 0x1630);
  ppIVar1 = ImVector<ImGuiViewportP_*>::operator[]
                      ((ImVector<ImGuiViewportP_*> *)((long)ini_handler.UserData + 0x1f28),0);
  local_88[0] = *ppIVar1;
  ImVector<ImGuiViewport_*>::push_back(this_00,(ImGuiViewport **)local_88);
  DockContextInitialize((ImGuiContext_conflict *)ini_handler.UserData);
  *(undefined1 *)ini_handler.UserData = 1;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    viewport->Flags = ImGuiViewportFlags_OwnedByApp;
    g.Viewports.push_back(viewport);
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

#ifdef IMGUI_HAS_DOCK
    // Initialize Docking
    DockContextInitialize(&g);
#endif

    g.Initialized = true;
}